

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletobin.cpp
# Opt level: O1

void fmprofiletobin::doit(bool step)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  undefined7 in_register_00000039;
  undefined8 uStack_1088;
  undefined8 uStack_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  fm_profile q;
  char line [4096];
  
  if ((int)CONCAT71(in_register_00000039,step) != 0) {
    q.deductible3 = 0.0;
    q.attachment = 0.0;
    q.limit = 0.0;
    q.share1 = 0.0;
    q.profile_id = 0;
    q.calcrule_id = 0;
    q.deductible1 = 0.0;
    q.deductible2 = 0.0;
    uStack_1078 = (OASIS_FLOAT *)0x0;
    uStack_1070 = (OASIS_FLOAT *)0x0;
    uStack_1088 = (OASIS_FLOAT *)0x0;
    uStack_1080 = (OASIS_FLOAT *)0x0;
    q.share2 = 0.0;
    q.share3 = 0.0;
    fgets(line,0x1000,_stdin);
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 != (char *)0x0) {
      uVar3 = 1;
      do {
        iVar1 = __isoc99_sscanf(line,"%d,%d,%f,%f,%f,%f,%f,%f,%f,%f,%d,%f,%f,%f,%f,%f,%f,%f",
                                &uStack_1088,(long)&uStack_1088 + 4,&uStack_1080,
                                (long)&uStack_1080 + 4,&uStack_1078,(long)&uStack_1078 + 4,
                                &uStack_1070,(long)&uStack_1070 + 4,&q,&q.calcrule_id,&q.deductible1
                                ,&q.deductible2,&q.deductible3,&q.attachment,&q.limit,&q.share1,
                                &q.share2,&q.share3);
        if (iVar1 != 0x12) {
          fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
          return;
        }
        fwrite(&uStack_1088,0x48,1,_stdout);
        uVar3 = uVar3 + 1;
        pcVar2 = fgets(line,0x1000,_stdin);
      } while (pcVar2 != (char *)0x0);
    }
    return;
  }
  q.deductible3 = 0.0;
  q.attachment = 0.0;
  q.limit = 0.0;
  q.share1 = 0.0;
  q.profile_id = 0;
  q.calcrule_id = 0;
  q.deductible1 = 0.0;
  q.deductible2 = 0.0;
  q.share2 = 0.0;
  q.share3 = 0.0;
  uStack_1070 = (OASIS_FLOAT *)0x10153a;
  fgets(line,0x1000,_stdin);
  uStack_1070 = (OASIS_FLOAT *)0x10154a;
  pcVar2 = fgets(line,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    uVar3 = 1;
    do {
      uStack_1078 = &q.share2;
      uStack_1080 = &q.share1;
      uStack_1088 = &q.limit;
      uStack_1070 = &q.share3;
      iVar1 = __isoc99_sscanf(line,"%d,%d,%f,%f,%f,%f,%f,%f,%f,%f",&q,&q.calcrule_id,&q.deductible1,
                              &q.deductible2,&q.deductible3,&q.attachment);
      if (iVar1 != 10) {
        uStack_1070 = (OASIS_FLOAT *)0x101624;
        fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
        return;
      }
      uStack_1070 = (OASIS_FLOAT *)0x1015d5;
      fwrite(&q,0x28,1,_stdout);
      uVar3 = uVar3 + 1;
      uStack_1070 = (OASIS_FLOAT *)0x1015ee;
      pcVar2 = fgets(line,0x1000,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void doit(bool step) {
		if (step) {
			dostep();
			return;
		}
        fm_profile q;
        char line[4096];
        int lineno = 0;
        fgets(line, sizeof(line), stdin);  // skip header
        lineno++;
        while (fgets(line, sizeof(line), stdin) != 0) {
#ifdef OASIS_FLOAT_TYPE_DOUBLE
            if (sscanf(line, "%d,%d,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf", &q.profile_id,
                       &q.calcrule_id, &q.deductible1, &q.deductible2,
                       &q.deductible3, &q.attachment, &q.limit, &q.share1,
                       &q.share2, &q.share3) != 10) {
#else
            if (sscanf(line, "%d,%d,%f,%f,%f,%f,%f,%f,%f,%f", &q.profile_id,
                       &q.calcrule_id, &q.deductible1, &q.deductible2,
                       &q.deductible3, &q.attachment, &q.limit, &q.share1,
                       &q.share2, &q.share3) != 10) {
#endif
                fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
                return;
            } else {
                fwrite(&q, sizeof(q), 1, stdout);
            }
            lineno++;
        }
    }

}